

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

int filemgr_is_writable(filemgr *file,bid_t bid)

{
  bool bVar1;
  ulong uVar2;
  
  if (((file->sb == (superblock *)0x0) ||
      ((file->sb->bmp_size).super___atomic_base<unsigned_long>._M_i == 0)) ||
     (sb_ops.is_writable == (_func_bool_filemgr_ptr_bid_t *)0x0)) {
    uVar2 = file->blocksize * bid;
    if (uVar2 < (file->pos).super___atomic_base<unsigned_long>._M_i) {
      bVar1 = (file->last_commit).super___atomic_base<unsigned_long>._M_i <= uVar2;
    }
    else {
      bVar1 = false;
    }
  }
  else {
    bVar1 = (*sb_ops.is_writable)(file,bid);
  }
  return (int)bVar1;
}

Assistant:

int filemgr_is_writable(struct filemgr *file, bid_t bid)
{
    if (sb_bmp_exists(file->sb) && sb_ops.is_writable) {
        // block reusing is enabled
        return sb_ops.is_writable(file, bid);
    } else {
        uint64_t pos = bid * file->blocksize;
        // Note that we don't need to grab file->lock here because
        // 1) both file->pos and file->last_commit are only incremented.
        // 2) file->last_commit is updated using the value of file->pos,
        //    and always equal to or smaller than file->pos.
        return (pos <  atomic_get_uint64_t(&file->pos) &&
                pos >= atomic_get_uint64_t(&file->last_commit));
    }
}